

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceDecomposition::unpackPreForceData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  uint uVar1;
  pointer pdVar2;
  
  Vector<double,_7U>::operator=(&this->selfPot,&sdat->selfPot);
  Vector<double,_7U>::operator=(&this->selectedSelfPot,&sdat->selePot);
  uVar1 = this->atomStorageLayout_;
  if ((uVar1 >> 8 & 1) != 0) {
    pdVar2 = (this->snap_->atomData).functional.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar2[atom] = sdat->frho + pdVar2[atom];
  }
  if ((uVar1 >> 9 & 1) != 0) {
    pdVar2 = (this->snap_->atomData).functionalDerivative.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar2[atom] = sdat->dfrhodrho + pdVar2[atom];
  }
  if (((uVar1 & 0x40) != 0) && (sdat->doParticlePot != false)) {
    (this->snap_->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[atom] = sdat->particlePot;
  }
  return;
}

Assistant:

void ForceDecomposition::unpackPreForceData(SelfData& sdat, int atom) {
    selfPot         = sdat.selfPot;
    selectedSelfPot = sdat.selePot;

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      snap_->atomData.functional[atom] += sdat.frho;
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      snap_->atomData.functionalDerivative[atom] += sdat.dfrhodrho;
    }

    if (sdat.doParticlePot &&
        (atomStorageLayout_ & DataStorage::dslParticlePot)) {
      snap_->atomData.particlePot[atom] = sdat.particlePot;
    }
  }